

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::AdaptorSignature::Decrypt
          (ByteData *__return_storage_ptr__,AdaptorSignature *this,Privkey *sk)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  secp256k1_context_struct *ctx_00;
  uchar *puVar4;
  uchar *adaptor_sig162;
  string *in_stack_fffffffffffffe40;
  string *message;
  size_type in_stack_fffffffffffffe48;
  CfdError CVar5;
  CfdException *in_stack_fffffffffffffe50;
  CfdException *this_00;
  allocator local_159;
  string local_158 [39];
  undefined1 local_131 [9];
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  string local_110 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  ByteData local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  int local_a4;
  undefined1 local_a0 [4];
  int ret;
  secp256k1_ecdsa_signature secp_signature;
  secp256k1_context_struct *ctx;
  allocator local_41;
  string local_40 [32];
  Privkey *local_20;
  Privkey *sk_local;
  AdaptorSignature *this_local;
  
  local_20 = sk;
  sk_local = (Privkey *)this;
  this_local = (AdaptorSignature *)__return_storage_ptr__;
  bVar1 = IsValid(this);
  if (!bVar1) {
    uVar3 = __cxa_allocate_exception(0x30);
    CVar5 = (CfdError)(in_stack_fffffffffffffe48 >> 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_40,"Invalid adaptor signature.",&local_41);
    CfdException::CfdException(in_stack_fffffffffffffe50,CVar5,in_stack_fffffffffffffe40);
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ctx_00 = wally_get_secp_context();
  secp_signature.data._56_8_ = ctx_00;
  Privkey::GetData(&local_d8,local_20);
  ByteData::GetBytes(&local_c0,&local_d8);
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x75ab59);
  ByteData::GetBytes(&local_f0,&this->data_);
  adaptor_sig162 =
       ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x75ab81);
  iVar2 = secp256k1_ecdsa_adaptor_decrypt
                    (ctx_00,(secp256k1_ecdsa_signature *)local_a0,puVar4,adaptor_sig162);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe40);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe40);
  ByteData::~ByteData((ByteData *)0x75abca);
  local_a4 = iVar2;
  if (iVar2 != 1) {
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    this_00 = (CfdException *)
              ((long)&signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_110,"Could not adapt signature.",(allocator *)this_00);
    CfdException::CfdException(this_00,(CfdError)((ulong)uVar3 >> 0x20),in_stack_fffffffffffffe40);
    signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  message = (string *)local_131;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x75ad1c);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48,(allocator_type *)message);
  CVar5 = (CfdError)(in_stack_fffffffffffffe48 >> 0x20);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x75ad42);
  uVar3 = secp_signature.data._56_8_;
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x75ad59);
  secp256k1_ecdsa_signature_serialize_compact
            ((secp256k1_context *)uVar3,puVar4,(secp256k1_ecdsa_signature *)local_a0);
  if (local_a4 != 1) {
    uVar3 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_158,"Could not serialize signature.",&local_159);
    CfdException::CfdException(in_stack_fffffffffffffe50,CVar5,message);
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_131 + 1));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  return __return_storage_ptr__;
}

Assistant:

ByteData AdaptorSignature::Decrypt(const Privkey &sk) const {
  if (!IsValid()) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Invalid adaptor signature.");
  }
  auto ctx = wally_get_secp_context();
  secp256k1_ecdsa_signature secp_signature;
  auto ret = secp256k1_ecdsa_adaptor_decrypt(
      ctx, &secp_signature, sk.GetData().GetBytes().data(),
      data_.GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not adapt signature.");
  }

  std::vector<uint8_t> signature(64);
  secp256k1_ecdsa_signature_serialize_compact(
      ctx, signature.data(), &secp_signature);

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not serialize signature.");
  }
  return ByteData(signature);
}